

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::dereference_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  bool bVar1;
  string *ts_1;
  string local_40;
  
  if (*(expr->_M_dataplus)._M_p == '&') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)expr);
  }
  else if ((this->backend).native_pointers == true) {
    local_40._M_dataplus._M_p._0_1_ = 0x2a;
    join<char,std::__cxx11::string_const&>
              (__return_storage_ptr__,(diligent_spirv_cross *)&local_40,(char *)expr,expr);
  }
  else {
    ts_1 = expr;
    bVar1 = Compiler::is_physical_pointer(&this->super_Compiler,expr_type);
    if ((bVar1) &&
       (bVar1 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,expr_type),
       !bVar1)) {
      enclose_expression(&local_40,(CompilerGLSL *)expr_type,expr);
      join<std::__cxx11::string,char_const(&)[7]>
                (__return_storage_ptr__,(diligent_spirv_cross *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".value",
                 (char (*) [7])ts_1);
      ::std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (is_physical_pointer(expr_type) && !is_physical_pointer_to_buffer_block(expr_type))
		return join(enclose_expression(expr), ".value");
	else
		return expr;
}